

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_padded<fmt::v6::internal::float_writer<char>>
          (basic_writer<fmt::v6::buffer_range<char>> *this,format_specs *specs,float_writer<char> *f
          )

{
  undefined8 *puVar1;
  long lVar2;
  byte bVar3;
  char *pcVar4;
  ulong uVar5;
  fill_t<char> *fill;
  size_t n;
  
  uVar5 = f->size_;
  n = (uint)specs->width - uVar5;
  if ((uint)specs->width < uVar5 || n == 0) {
    puVar1 = *(undefined8 **)this;
    lVar2 = puVar1[2];
    uVar5 = uVar5 + lVar2;
    if ((ulong)puVar1[3] < uVar5) {
      (**(code **)*puVar1)(puVar1,uVar5);
    }
    puVar1[2] = uVar5;
    pcVar4 = (char *)(lVar2 + puVar1[1]);
    uVar5 = (ulong)(byte)(f->specs_).field_0x5;
    if (uVar5 != 0) {
      *pcVar4 = *(char *)((long)&basic_data<void>::signs + uVar5);
      pcVar4 = pcVar4 + 1;
    }
LAB_0012c707:
    float_writer<char>::prettify<char*>(f,pcVar4);
    return;
  }
  puVar1 = *(undefined8 **)this;
  lVar2 = puVar1[2];
  uVar5 = (specs->fill).size_ * n + uVar5 + lVar2;
  if ((ulong)puVar1[3] < uVar5) {
    (**(code **)*puVar1)(puVar1,uVar5);
  }
  puVar1[2] = uVar5;
  pcVar4 = (char *)(lVar2 + puVar1[1]);
  fill = &specs->fill;
  bVar3 = specs->field_0x9 & 0xf;
  if (bVar3 == 3) {
    pcVar4 = fill<char*,char>(pcVar4,n >> 1,fill);
    uVar5 = (ulong)(byte)(f->specs_).field_0x5;
    if (uVar5 != 0) {
      *pcVar4 = *(char *)((long)&basic_data<void>::signs + uVar5);
      pcVar4 = pcVar4 + 1;
    }
    pcVar4 = float_writer<char>::prettify<char*>(f,pcVar4);
    n = n - (n >> 1);
  }
  else {
    if (bVar3 == 2) {
      pcVar4 = fill<char*,char>(pcVar4,n,fill);
      uVar5 = (ulong)(byte)(f->specs_).field_0x5;
      if (uVar5 != 0) {
        *pcVar4 = *(char *)((long)&basic_data<void>::signs + uVar5);
        pcVar4 = pcVar4 + 1;
      }
      goto LAB_0012c707;
    }
    uVar5 = (ulong)(byte)(f->specs_).field_0x5;
    if (uVar5 != 0) {
      *pcVar4 = *(char *)((long)&basic_data<void>::signs + uVar5);
      pcVar4 = pcVar4 + 1;
    }
    pcVar4 = float_writer<char>::prettify<char*>(f,pcVar4);
  }
  fill<char*,char>(pcVar4,n,fill);
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }